

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stlio.hpp
# Opt level: O3

pair<tyti::stl::basic_solid<float>,_bool> * __thiscall
tyti::stl::read<float,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (pair<tyti::stl::basic_solid<float>,_bool> *__return_storage_ptr__,stl *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                end)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool r;
  basic_solid<float> o;
  bool local_81;
  basic_solid<float> local_80;
  
  paVar1 = &local_80.header.field_2;
  local_80.header._M_string_length = 0;
  local_80.header.field_2._M_local_buf[0] = '\0';
  local_80.normals.
  super__Vector_base<tyti::stl::basic_vec3<float>,_std::allocator<tyti::stl::basic_vec3<float>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_80.normals.
  super__Vector_base<tyti::stl::basic_vec3<float>,_std::allocator<tyti::stl::basic_vec3<float>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_80.normals.
  super__Vector_base<tyti::stl::basic_vec3<float>,_std::allocator<tyti::stl::basic_vec3<float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_80.vertices.
  super__Vector_base<tyti::stl::basic_vec3<float>,_std::allocator<tyti::stl::basic_vec3<float>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_80.vertices.
  super__Vector_base<tyti::stl::basic_vec3<float>,_std::allocator<tyti::stl::basic_vec3<float>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_80.vertices.
  super__Vector_base<tyti::stl::basic_vec3<float>,_std::allocator<tyti::stl::basic_vec3<float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_80.attributes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_80.attributes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_80.attributes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_80.header._M_dataplus._M_p = (pointer)paVar1;
  local_81 = read<float,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                       (&local_80,
                        (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         )this,begin);
  std::pair<tyti::stl::basic_solid<float>,_bool>::pair<tyti::stl::basic_solid<float>,_bool,_true>
            (__return_storage_ptr__,&local_80,&local_81);
  if (local_80.attributes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.attributes.
                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.attributes.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.attributes.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_80.vertices.
      super__Vector_base<tyti::stl::basic_vec3<float>,_std::allocator<tyti::stl::basic_vec3<float>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.vertices.
                    super__Vector_base<tyti::stl::basic_vec3<float>,_std::allocator<tyti::stl::basic_vec3<float>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_80.vertices.
                          super__Vector_base<tyti::stl::basic_vec3<float>,_std::allocator<tyti::stl::basic_vec3<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.vertices.
                          super__Vector_base<tyti::stl::basic_vec3<float>,_std::allocator<tyti::stl::basic_vec3<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_80.normals.
      super__Vector_base<tyti::stl::basic_vec3<float>,_std::allocator<tyti::stl::basic_vec3<float>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.normals.
                    super__Vector_base<tyti::stl::basic_vec3<float>,_std::allocator<tyti::stl::basic_vec3<float>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_80.normals.
                          super__Vector_base<tyti::stl::basic_vec3<float>,_std::allocator<tyti::stl::basic_vec3<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.normals.
                          super__Vector_base<tyti::stl::basic_vec3<float>,_std::allocator<tyti::stl::basic_vec3<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.header._M_dataplus._M_p != paVar1) {
    operator_delete(local_80.header._M_dataplus._M_p,
                    CONCAT71(local_80.header.field_2._M_allocated_capacity._1_7_,
                             local_80.header.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::pair< basic_solid<T>, bool > read(IterT begin, IterT end)
        {
            basic_solid<T> o;
            bool r = read(o, begin, end);
            return std::make_pair<basic_solid<T>, bool>(std::move(o), std::move(r));
        }